

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledInputFile::rawTileData
          (TiledInputFile *this,int *dx,int *dy,int *lx,int *ly,char **pixelData,int *pixelDataSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  ArgExc *pAVar7;
  TileBuffer *pTVar8;
  IoExc *this_00;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  TiledInputFile *in_RDI;
  int *in_R8;
  undefined8 *in_R9;
  Lock *in_stack_00000008;
  stringstream _iex_replace_s;
  BaseExc *e;
  int old_ly;
  int old_lx;
  int old_dy;
  int old_dx;
  TileBuffer *tileBuffer;
  Lock lock;
  undefined8 in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  Data *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  int *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  InputStreamMutex *in_stack_fffffffffffffda0;
  IStream *in_stack_fffffffffffffdb0;
  Int64 *in_stack_fffffffffffffdb8;
  
  IlmThread_2_5::Lock::Lock
            ((Lock *)in_stack_fffffffffffffd80,
             (Mutex *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             SUB81((ulong)in_stack_fffffffffffffd70 >> 0x38,0));
  bVar5 = isValidTile(in_RDI,*in_RSI,*in_RDX,*in_RCX,*in_R8);
  if (!bVar5) {
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar7,"Tried to read a tile outside the image file\'s data window.");
    __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pTVar8 = Data::getTileBuffer(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  iVar1 = *in_RSI;
  iVar2 = *in_RDX;
  iVar3 = *in_RCX;
  iVar4 = *in_R8;
  iVar6 = version(in_RDI);
  bVar5 = isMultiPart(iVar6);
  if (bVar5) {
    in_stack_fffffffffffffdb0 = in_RDI->_data->_streamData->is;
    in_stack_fffffffffffffdb8 =
         TileOffsets::operator()
                   ((TileOffsets *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                    (int)((ulong)in_stack_fffffffffffffd80 >> 0x20),(int)in_stack_fffffffffffffd80,
                    in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78);
    (*in_stack_fffffffffffffdb0->_vptr_IStream[6])
              (in_stack_fffffffffffffdb0,*in_stack_fffffffffffffdb8);
  }
  anon_unknown_8::readNextTileData
            (in_stack_fffffffffffffda0,
             (Data *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
             in_stack_fffffffffffffd90,
             (int *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (int *)in_stack_fffffffffffffd80,
             (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (char **)in_stack_fffffffffffffdb0,(int *)in_stack_fffffffffffffdb8);
  bVar5 = isValidLevel((TiledInputFile *)
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                       (int)((ulong)in_stack_00000008 >> 0x20),(int)in_stack_00000008);
  if ((bVar5) && (bVar5 = isValidTile(in_RDI,*in_RSI,*in_RDX,*in_RCX,*in_R8), bVar5)) {
    iVar6 = version(in_RDI);
    bVar5 = isMultiPart(iVar6);
    if (bVar5) {
      if ((((iVar1 != *in_RSI) || (iVar2 != *in_RDX)) || (iVar3 != *in_RCX)) || (iVar4 != *in_R8)) {
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar7,"rawTileData read the wrong tile");
        __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
    else {
      bVar5 = isValidTile(in_RDI,*in_RSI,*in_RDX,*in_RCX,*in_R8);
      if (!bVar5) {
        this_00 = (IoExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::IoExc::IoExc(this_00,"rawTileData read an invalid tile");
        __cxa_throw(this_00,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
      }
    }
    *in_R9 = pTVar8->buffer;
    IlmThread_2_5::Lock::~Lock(in_stack_00000008);
    return;
  }
  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar7,"File contains an invalid tile");
  __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
TiledInputFile::rawTileData (int &dx, int &dy,
			     int &lx, int &ly,
                             const char *&pixelData,
			     int &pixelDataSize)
{
    try
    {
        Lock lock (*_data->_streamData);

        if (!isValidTile (dx, dy, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Tried to read a tile outside "
			       "the image file's data window.");

        TileBuffer *tileBuffer = _data->getTileBuffer (0);

        //
        // if file is a multipart file, we have to seek to the required tile
        // since we don't know where the file pointer is
        //
        int old_dx=dx;
        int old_dy=dy;
        int old_lx=lx;
        int old_ly=ly;
        if(isMultiPart(version()))
        {
            _data->_streamData->is->seekg(_data->tileOffsets(dx,dy,lx,ly));
        }
        readNextTileData (_data->_streamData, _data, dx, dy, lx, ly,
			  tileBuffer->buffer,
                          pixelDataSize);

        if ( !isValidLevel(lx,ly) || !isValidTile (dx, dy, lx, ly) )
            throw IEX_NAMESPACE::ArgExc ("File contains an invalid tile");


        if(isMultiPart(version()))
        {
            if (old_dx!=dx || old_dy !=dy || old_lx!=lx || old_ly!=ly)
            {
                throw IEX_NAMESPACE::ArgExc ("rawTileData read the wrong tile");
            }
        }
        else
        {
             if(!isValidTile (dx, dy, lx, ly) )
             {
                 throw IEX_NAMESPACE::IoExc ("rawTileData read an invalid tile");
             }
        }
        pixelData = tileBuffer->buffer;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}